

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O0

bool __thiscall libwebm::VpxPesParser::VerifyPacketStartCode(VpxPesParser *this)

{
  long lVar1;
  size_type sVar2;
  const_reference pvVar3;
  VpxPesParser *this_local;
  
  lVar1 = *(long *)(this + 0x70);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58));
  if ((((lVar1 + 2U <= sVar2) &&
       (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                            *(size_type *)(this + 0x70)), *pvVar3 == '\0')) &&
      (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                           *(long *)(this + 0x70) + 1), *pvVar3 == '\0')) &&
     (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                          *(long *)(this + 0x70) + 2), *pvVar3 == '\x01')) {
    return true;
  }
  return false;
}

Assistant:

bool VpxPesParser::VerifyPacketStartCode() const {
  if (read_pos_ + 2 > pes_file_data_.size())
    return false;

  // PES packets all start with the byte sequence 0x0 0x0 0x1.
  if (pes_file_data_[read_pos_] != 0 || pes_file_data_[read_pos_ + 1] != 0 ||
      pes_file_data_[read_pos_ + 2] != 1) {
    return false;
  }

  return true;
}